

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O0

void Bbl_ManDumpBinaryBlif(Bbl_Man_t *p,char *pFileName)

{
  FILE *__stream;
  FILE *pFile;
  char *pFileName_local;
  Bbl_Man_t *p_local;
  
  __stream = fopen(pFileName,"wb");
  Vec_StrWrite((FILE *)__stream,p->pName);
  Vec_StrWrite((FILE *)__stream,p->pObjs);
  Vec_StrWrite((FILE *)__stream,p->pFncs);
  fclose(__stream);
  return;
}

Assistant:

void Bbl_ManDumpBinaryBlif( Bbl_Man_t * p, char * pFileName )
{
    FILE * pFile;
    pFile = fopen( pFileName, "wb" );
    Vec_StrWrite( pFile, p->pName );
    Vec_StrWrite( pFile, p->pObjs );
    Vec_StrWrite( pFile, p->pFncs );
    fclose( pFile );
}